

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_eor_8_ix(void)

{
  byte bVar1;
  uint address;
  uint uVar2;
  uint value;
  
  address = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  uVar2 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  value = uVar2 & 0xff ^ (uint)bVar1;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_eor_8_ix(void)
{
	uint ea = EA_AY_IX_8();
	uint res = MASK_OUT_ABOVE_8(DX ^ m68ki_read_8(ea));

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}